

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deque.hpp
# Opt level: O0

bool ft::operator<(deque<int,_ft::allocator<int>_> *lhs,deque<int,_ft::allocator<int>_> *rhs)

{
  bool bVar1;
  const_iterator local_c8;
  const_iterator local_a0;
  const_iterator local_68;
  const_iterator local_40;
  deque<int,_ft::allocator<int>_> *local_18;
  deque<int,_ft::allocator<int>_> *rhs_local;
  deque<int,_ft::allocator<int>_> *lhs_local;
  
  local_18 = rhs;
  rhs_local = lhs;
  deque<int,_ft::allocator<int>_>::begin(&local_40,lhs);
  deque<int,_ft::allocator<int>_>::end(&local_68,rhs_local);
  deque<int,_ft::allocator<int>_>::begin(&local_a0,local_18);
  deque<int,_ft::allocator<int>_>::end(&local_c8,local_18);
  bVar1 = lexicographical_compare<ft::constDequeIterator<int,64ul>,ft::constDequeIterator<int,64ul>>
                    (&local_40,&local_68,&local_a0,&local_c8,(type *)0x0,(type *)0x0);
  constDequeIterator<int,_64UL>::~constDequeIterator(&local_c8);
  constDequeIterator<int,_64UL>::~constDequeIterator(&local_a0);
  constDequeIterator<int,_64UL>::~constDequeIterator(&local_68);
  constDequeIterator<int,_64UL>::~constDequeIterator(&local_40);
  return bVar1;
}

Assistant:

bool operator<(deque<T, Alloc> const & lhs, deque<T, Alloc> const & rhs) {
	return ft::lexicographical_compare(lhs.begin(), lhs.end(), rhs.begin(), rhs.end());
}